

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

void * __thiscall
density::
heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
::reentrant_consume_operation::unaligned_element_ptr(reentrant_consume_operation *this)

{
  ControlBlock *pCVar1;
  uintptr_t uint_pointer;
  ControlBlock *pCVar2;
  
  pCVar2 = this->m_control;
  if (pCVar2 == (ControlBlock *)0x0) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0x7d9);
    pCVar2 = this->m_control;
  }
  pCVar1 = pCVar2 + 2;
  if ((pCVar2->m_next & 4) != 0) {
    pCVar1 = (ControlBlock *)pCVar1->m_next;
  }
  return pCVar1;
}

Assistant:

bool empty() const noexcept { return m_control == nullptr; }